

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O2

void __thiscall
QDataBuffer<QScanConverter::Line>::shrink(QDataBuffer<QScanConverter::Line> *this,qsizetype size)

{
  Line *pLVar1;
  
  if (size == 0) {
    QtPrivate::sizedFree(this->buffer,this->capacity << 5);
    this->capacity = 0;
    this->siz = 0;
    this->buffer = (Line *)0x0;
  }
  else {
    this->capacity = size;
    pLVar1 = (Line *)QtPrivate::fittedRealloc(this->buffer,0,&this->capacity,0x20,0);
    this->buffer = pLVar1;
    if (this->siz < size) {
      size = this->siz;
    }
    this->siz = size;
  }
  return;
}

Assistant:

void shrink(qsizetype size) {
        Q_ASSERT(capacity >= size);
        if (size) {
            capacity = size;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
            siz = std::min(siz, size);
        } else {
            QtPrivate::sizedFree(buffer, capacity, sizeof(Type));
            capacity = size;
            buffer = nullptr;
            siz = 0;
        }
    }